

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O3

char * bson_iter_utf8(bson_iter_t *iter,uint32_t *length)

{
  size_t *psVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  double dVar5;
  int64_t iVar6;
  _Bool _Var7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  size_t sVar13;
  ulong uVar14;
  code *pcVar15;
  bson_oid_t *pbVar16;
  char *__s;
  ulong uVar17;
  void *mem;
  long *in_RCX;
  undefined8 uVar18;
  int32_t iVar19;
  undefined4 *extraout_RDX;
  ulong *extraout_RDX_00;
  undefined4 *extraout_RDX_01;
  undefined8 extraout_RDX_02;
  bson_error_t *error;
  size_t __n;
  bson_json_destroy_cb p_Var20;
  anon_union_24_17_78d57918_for_value *dst;
  long lVar21;
  bson_json_reader_cb num_bytes;
  size_t sVar22;
  bson_error_t *__s_00;
  bson_t *pbVar23;
  bool bVar24;
  uint32_t uVar25;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  bson_error_t bStack_4e0;
  uint32_t uStack_220;
  _Bool _Stack_219;
  bson_t *pbStack_218;
  uint32_t uStack_210;
  uint32_t uStack_20c;
  uint8_t *puStack_208;
  char *apcStack_200 [44];
  
  if (iter != (bson_iter_t *)0x0) {
    puVar11 = iter->raw;
    if (puVar11[iter->type] != '\x02') {
      if (length != (uint32_t *)0x0) {
        *length = 0;
      }
      return (char *)0x0;
    }
    if (length != (uint32_t *)0x0) {
      iVar9 = 1;
      if (1 < *(int *)(puVar11 + iter->d1)) {
        iVar9 = *(int *)(puVar11 + iter->d1);
      }
      *length = iVar9 - 1;
    }
    return (char *)(puVar11 + iter->d2);
  }
  bson_iter_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar11 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar11[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x02') {
      uVar8 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      sVar22 = 1;
      if (1 < (int)*(uint *)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        sVar22 = (size_t)*(uint *)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)
        ;
      }
      uVar25 = (int)sVar22 - 1;
      pcVar10 = (char *)bson_malloc0(sVar22);
      memcpy(pcVar10,puVar11 + uVar8,(ulong)uVar25);
      pcVar10[uVar25] = '\0';
    }
    else {
      uVar25 = 0;
      pcVar10 = (char *)0x0;
    }
    if ((bson_t *)length != (bson_t *)0x0) {
      ((bson_t *)length)->flags = uVar25;
    }
    return pcVar10;
  }
  bson_iter_dup_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar11 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar11[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\r') {
      if ((bson_t *)length != (bson_t *)0x0) {
        ((bson_t *)length)->flags = 0;
      }
      return (char *)0x0;
    }
    if ((bson_t *)length != (bson_t *)0x0) {
      iVar9 = 1;
      if (1 < *(int *)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar9 = *(int *)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      ((bson_t *)length)->flags = iVar9 - 1;
    }
    return (char *)(puVar11 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4)
                   );
  }
  bson_iter_code_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_codewscope_cold_2();
  }
  else {
    puVar11 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar11[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x0f') {
      if ((bson_t *)length != (bson_t *)0x0) {
        ((bson_t *)length)->flags = 0;
      }
      if (extraout_RDX != (undefined4 *)0x0) {
        *extraout_RDX = 0;
      }
      if (in_RCX != (long *)0x0) {
        *in_RCX = 0;
      }
      return (char *)0x0;
    }
    if ((bson_t *)length == (bson_t *)0x0) {
LAB_00111197:
      *extraout_RDX =
           *(undefined4 *)
            (puVar11 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4));
      *in_RCX = (long)(puVar11 +
                      *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4));
      return (char *)(uint8_t *)
                     ((long)(((bson_json_reader_t *)iter)->producer).data +
                     (ulong)(uint)(((bson_json_reader_t *)iter)->producer).buf_size);
    }
    if (*(int *)(puVar11 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4))
        != 0) {
      ((bson_t *)length)->flags =
           *(int *)(puVar11 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4)
                   ) - 1;
      goto LAB_00111197;
    }
  }
  bson_iter_codewscope_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (extraout_RDX_00 != (ulong *)0x0) {
      *extraout_RDX_00 = 0;
    }
    if (in_RCX != (long *)0x0) {
      *in_RCX = 0;
    }
    puVar11 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar11[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\f') {
      if ((bson_t *)length != (bson_t *)0x0) {
        uVar8 = *(uint *)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        puVar11 = (uint8_t *)(ulong)uVar8;
        ((bson_t *)length)->flags = uVar8;
        if (uVar8 != 0) {
          puVar11 = (uint8_t *)(ulong)(uVar8 - 1);
          ((bson_t *)length)->flags = uVar8 - 1;
        }
      }
      if (extraout_RDX_00 != (ulong *)0x0) {
        puVar11 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4));
        *extraout_RDX_00 = (ulong)puVar11;
      }
      if (in_RCX != (long *)0x0) {
        puVar11 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)(uint)(((bson_json_reader_t *)iter)->producer).buf_size);
        *in_RCX = (long)puVar11;
      }
    }
    return (char *)puVar11;
  }
  bson_iter_dbpointer_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar11 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar11[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x0e') {
      puVar12 = puVar11 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar9 = 1;
      if (1 < *(int *)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar9 = *(int *)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      uVar25 = iVar9 - 1;
    }
    else {
      puVar12 = (uint8_t *)0x0;
      uVar25 = 0;
    }
    if ((bson_t *)length != (bson_t *)0x0) {
      ((bson_t *)length)->flags = uVar25;
    }
    return (char *)puVar12;
  }
  bson_iter_symbol_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar11 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar11[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      return (char *)0x0;
    }
    return *(char **)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
  }
  bson_iter_date_time_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar11 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar11[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      return (char *)0x0;
    }
    return (char *)(*(ulong *)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) /
                   1000);
  }
  bson_iter_time_t_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar11 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar25 = 0;
    pcVar10 = (char *)0x0;
    if (puVar11[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x11') {
      pcVar10 = *(char **)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      uVar25 = (uint32_t)((ulong)pcVar10 >> 0x20);
    }
    if ((bson_t *)length != (bson_t *)0x0) {
      ((bson_t *)length)->flags = uVar25;
    }
    if (extraout_RDX_01 != (undefined4 *)0x0) {
      *extraout_RDX_01 = (int)pcVar10;
    }
    return pcVar10;
  }
  bson_iter_timestamp_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar11 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar11[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      ((bson_t *)length)->flags = 0;
      ((bson_t *)length)->len = 0;
      ((bson_t *)length)->padding[0] = '\0';
      ((bson_t *)length)->padding[1] = '\0';
      ((bson_t *)length)->padding[2] = '\0';
      ((bson_t *)length)->padding[3] = '\0';
      ((bson_t *)length)->padding[4] = '\0';
      ((bson_t *)length)->padding[5] = '\0';
      ((bson_t *)length)->padding[6] = '\0';
      ((bson_t *)length)->padding[7] = '\0';
      return (char *)puVar11;
    }
    lVar21 = *(long *)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    *(long *)length = lVar21 / 1000;
    pcVar10 = (char *)((lVar21 % 1000) * 1000);
    *(char **)((bson_t *)length)->padding = pcVar10;
    return pcVar10;
  }
  bson_iter_timeval_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_visit_all_cold_2();
  }
  else if ((bson_t *)length != (bson_t *)0x0) {
    _Var7 = _bson_iter_next_internal(iter,(char **)&puStack_208,&uStack_210,&_Stack_219);
    if (_Var7) {
      do {
        puVar11 = puStack_208;
        if (*puStack_208 != '\0') {
          sVar13 = strlen((char *)puStack_208);
          _Var7 = bson_utf8_validate((char *)puVar11,sVar13,false);
          if (!_Var7) {
            *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
                 *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            break;
          }
        }
        if ((*(code **)length != (code *)0x0) &&
           (uVar14 = (**(code **)length)(iter,puVar11,extraout_RDX_02), (char)uVar14 != '\0'))
        goto LAB_0011196e;
        switch(uStack_210) {
        case 1:
          pcVar15 = *(code **)(((bson_t *)length)->padding + 0x10);
          if (pcVar15 == (code *)0x0) break;
          dVar5 = bson_iter_double(iter);
          uVar14 = (*pcVar15)(SUB84(dVar5,0),iter,puVar11,extraout_RDX_02);
          goto LAB_001118b2;
        case 2:
          pcVar10 = bson_iter_utf8(iter,(uint32_t *)apcStack_200);
          _Var7 = bson_utf8_validate(pcVar10,(ulong)apcStack_200[0] & 0xffffffff,true);
          if (!_Var7) {
LAB_00111968:
            uVar8 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            uVar14 = (ulong)uVar8;
            *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) = uVar8;
            goto LAB_0011196e;
          }
          pcVar15 = *(code **)(((bson_t *)length)->padding + 0x18);
          goto LAB_001117d4;
        case 3:
          pbStack_218 = (bson_t *)0x0;
          uStack_220 = 0;
          bson_iter_document(iter,&uStack_220,(uint8_t **)&pbStack_218);
          _Var7 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_220);
          if (_Var7) {
            pcVar15 = *(code **)(((bson_t *)length)->padding + 0x20);
            goto LAB_0011181e;
          }
          break;
        case 4:
          pbStack_218 = (bson_t *)0x0;
          uStack_220 = 0;
          bson_iter_array(iter,&uStack_220,(uint8_t **)&pbStack_218);
          _Var7 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_220);
          if (_Var7) {
            pcVar15 = *(code **)(((bson_t *)length)->padding + 0x28);
            goto LAB_0011181e;
          }
          break;
        case 5:
          apcStack_200[0] = (char *)0x0;
          pbStack_218 = (bson_t *)((ulong)pbStack_218 & 0xffffffff00000000);
          uStack_220 = 0;
          bson_iter_binary(iter,(bson_subtype_t *)&pbStack_218,&uStack_220,(uint8_t **)apcStack_200)
          ;
          if (*(code **)(((bson_t *)length)->padding + 0x30) != (code *)0x0) {
            uVar14 = (**(code **)(((bson_t *)length)->padding + 0x30))
                               (iter,puVar11,(ulong)pbStack_218 & 0xffffffff,uStack_220,
                                apcStack_200[0],extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        case 6:
          pcVar15 = *(code **)(((bson_t *)length)->padding + 0x38);
          goto LAB_0011178a;
        case 7:
          pcVar15 = *(code **)(((bson_t *)length)->padding + 0x40);
          if (pcVar15 != (code *)0x0) {
            pbVar16 = bson_iter_oid(iter);
LAB_001118a3:
            uVar14 = (*pcVar15)(iter,puVar11,pbVar16,extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        case 8:
          pcVar15 = *(code **)(((bson_t *)length)->padding + 0x48);
          if (pcVar15 != (code *)0x0) {
            _Var7 = bson_iter_bool(iter);
            uVar8 = (uint)_Var7;
LAB_00111710:
            uVar14 = (*pcVar15)(iter,puVar11,uVar8,extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        case 9:
          pcVar15 = *(code **)(((bson_t *)length)->padding + 0x50);
          if (pcVar15 != (code *)0x0) {
            pbVar16 = (bson_oid_t *)bson_iter_date_time(iter);
            goto LAB_001118a3;
          }
          break;
        case 10:
          pcVar15 = *(code **)(((bson_t *)length)->padding + 0x58);
LAB_0011178a:
          if (pcVar15 == (code *)0x0) break;
LAB_00111799:
          uVar14 = (*pcVar15)(iter,puVar11,extraout_RDX_02);
          goto LAB_001118b2;
        case 0xb:
          apcStack_200[0] = (char *)0x0;
          __s = bson_iter_regex(iter,apcStack_200);
          sVar13 = strlen(__s);
          _Var7 = bson_utf8_validate(__s,sVar13,true);
          if (!_Var7) goto LAB_00111968;
          pcVar15 = *(code **)(((bson_t *)length)->padding + 0x60);
          pcVar10 = apcStack_200[0];
          if (pcVar15 == (code *)0x0) break;
          goto LAB_0011188b;
        case 0xc:
          uStack_220 = 0;
          apcStack_200[0] = (char *)0x0;
          pbStack_218 = (bson_t *)0x0;
          bson_iter_dbpointer(iter,&uStack_220,apcStack_200,(bson_oid_t **)&pbStack_218);
          _Var7 = bson_utf8_validate(apcStack_200[0],(ulong)uStack_220,true);
          if (!_Var7) goto LAB_00111968;
          pcVar15 = *(code **)(((bson_t *)length)->padding + 0x68);
          pcVar10 = apcStack_200[0];
          pbVar23 = pbStack_218;
          if (pcVar15 != (code *)0x0) {
LAB_001115a8:
            uVar14 = (*pcVar15)(iter,puVar11,uStack_220,pcVar10,pbVar23,extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        case 0xd:
          pcVar10 = bson_iter_code(iter,(uint32_t *)apcStack_200);
          _Var7 = bson_utf8_validate(pcVar10,(ulong)apcStack_200[0] & 0xffffffff,true);
          if (!_Var7) goto LAB_00111968;
          pcVar15 = *(code **)(((bson_t *)length)->padding + 0x70);
          goto LAB_001117d4;
        case 0xe:
          pcVar10 = bson_iter_symbol(iter,(uint32_t *)apcStack_200);
          _Var7 = bson_utf8_validate(pcVar10,(ulong)apcStack_200[0] & 0xffffffff,true);
          if (!_Var7) goto LAB_00111968;
          pcVar15 = *(code **)((long)length + 0x80);
LAB_001117d4:
          if (pcVar15 != (code *)0x0) {
            __s = (char *)((ulong)apcStack_200[0] & 0xffffffff);
LAB_0011188b:
            uVar14 = (*pcVar15)(iter,puVar11,__s,pcVar10,extraout_RDX_02);
LAB_001118b2:
            if ((char)uVar14 != '\0') goto LAB_0011196e;
          }
          break;
        case 0xf:
          uStack_220 = 0;
          pbStack_218 = (bson_t *)0x0;
          uStack_20c = 0;
          pcVar10 = bson_iter_codewscope(iter,&uStack_220,&uStack_20c,(uint8_t **)&pbStack_218);
          _Var7 = bson_utf8_validate(pcVar10,(ulong)uStack_220,true);
          if (!_Var7) goto LAB_00111968;
          _Var7 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_20c);
          if ((_Var7) &&
             (pcVar15 = *(code **)((bson_t *)((long)length + 0x80))->padding, pcVar15 != (code *)0x0
             )) {
            pbVar23 = (bson_t *)apcStack_200;
            goto LAB_001115a8;
          }
          break;
        case 0x10:
          pcVar15 = *(code **)(((bson_t *)((long)length + 0x80))->padding + 8);
          if (pcVar15 != (code *)0x0) {
            uVar8 = bson_iter_int32(iter);
            goto LAB_00111710;
          }
          break;
        case 0x11:
          bson_iter_timestamp(iter,(uint32_t *)apcStack_200,(uint32_t *)&pbStack_218);
          if (*(code **)(((bson_t *)((long)length + 0x80))->padding + 0x10) != (code *)0x0) {
            uVar14 = (**(code **)(((bson_t *)((long)length + 0x80))->padding + 0x10))
                               (iter,puVar11,(ulong)apcStack_200[0] & 0xffffffff,
                                (ulong)pbStack_218 & 0xffffffff,extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        case 0x12:
          pcVar15 = *(code **)(((bson_t *)((long)length + 0x80))->padding + 0x18);
          if (pcVar15 != (code *)0x0) {
            pbVar16 = (bson_oid_t *)bson_iter_int64(iter);
            goto LAB_001118a3;
          }
          break;
        case 0x13:
          bson_iter_decimal128(iter,(bson_decimal128_t *)apcStack_200);
          pcVar15 = *(code **)(((bson_t *)((long)length + 0x80))->padding + 0x38);
LAB_0011181e:
          if (pcVar15 != (code *)0x0) {
            uVar14 = (*pcVar15)(iter,puVar11,(bson_t *)apcStack_200,extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        default:
          if (uStack_210 == 0x7f) {
            pcVar15 = *(code **)(((bson_t *)((long)length + 0x80))->padding + 0x20);
          }
          else {
            if (uStack_210 != 0xff) break;
            pcVar15 = *(code **)(((bson_t *)((long)length + 0x80))->padding + 0x28);
          }
          if (pcVar15 == (code *)0x0) break;
          puVar11 = (uint8_t *)
                    ((long)(((bson_json_reader_t *)iter)->producer).data +
                    (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).dcb + 4));
          goto LAB_00111799;
        }
        if ((*(code **)((bson_t *)length)->padding != (code *)0x0) &&
           (uVar14 = (**(code **)((bson_t *)length)->padding)
                               (iter,(uint8_t *)
                                     ((long)(((bson_json_reader_t *)iter)->producer).data +
                                     (ulong)*(uint32_t *)
                                             ((long)&(((bson_json_reader_t *)iter)->producer).dcb +
                                             4)),extraout_RDX_02), (char)uVar14 != '\0')) {
LAB_0011196e:
          return (char *)CONCAT71((int7)(uVar14 >> 8),1);
        }
        _Var7 = _bson_iter_next_internal(iter,(char **)&puStack_208,&uStack_210,&_Stack_219);
      } while (_Var7);
    }
    if (*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) != 0) {
      if ((_Stack_219 == true) &&
         (*(long *)(((bson_t *)((long)length + 0x80))->padding + 0x30) != 0)) {
        sVar13 = strlen((char *)puStack_208);
        _Var7 = bson_utf8_validate((char *)puStack_208,sVar13,false);
        if (_Var7) {
          (**(code **)(((bson_t *)((long)length + 0x80))->padding + 0x30))
                    (iter,puStack_208,uStack_210,extraout_RDX_02);
          return (char *)0x0;
        }
      }
      if (*(code **)(((bson_t *)length)->padding + 8) != (code *)0x0) {
        (**(code **)(((bson_t *)length)->padding + 8))(iter,extraout_RDX_02);
      }
    }
    return (char *)0x0;
  }
  bson_iter_visit_all_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar11 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar11[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\b') {
      puVar11[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] = (uint8_t)length;
    }
    return (char *)puVar11;
  }
  bson_iter_overwrite_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar11 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar11[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x10') {
      *(int *)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = (int)length;
    }
    return (char *)puVar11;
  }
  bson_iter_overwrite_int32_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar11 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar11[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x12') {
      *(uint32_t **)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = length;
    }
    return (char *)puVar11;
  }
  bson_iter_overwrite_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar11 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar11[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x01') {
      *(ulong *)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) =
           CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    }
    return (char *)puVar11;
  }
  bson_iter_overwrite_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar11 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar11[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x13') {
      uVar8 = *(uint *)&(((bson_json_reader_t *)iter)->producer).buf;
      lVar21 = *(long *)((bson_t *)length)->padding;
      *(long *)(puVar11 + uVar8) = *(long *)length;
      *(long *)((long)(puVar11 + uVar8) + 8) = lVar21;
    }
    return (char *)puVar11;
  }
  bson_iter_overwrite_decimal128_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_value_cold_1();
    if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
      bson_json_reader_read_cold_2();
    }
    else if ((bson_t *)length != (bson_t *)0x0) {
      (((bson_json_reader_t *)iter)->bson).bson = (bson_t *)length;
      (((bson_json_reader_t *)iter)->bson).n = -1;
      (((bson_json_reader_t *)iter)->bson).read_state = BSON_JSON_REGULAR;
      __s_00 = &bStack_4e0;
      if (error != (bson_error_t *)0x0) {
        __s_00 = error;
      }
      ((bson_json_reader_t *)iter)->error = __s_00;
      memset(__s_00,0,0x200);
      sVar22 = (((bson_json_reader_t *)iter)->producer).bytes_read;
      bVar24 = false;
      while( true ) {
        sVar3 = ((bson_json_reader_t *)iter)->json->pos;
        if (sVar22 == 0) {
          sVar22 = (*(((bson_json_reader_t *)iter)->producer).cb)
                             ((((bson_json_reader_t *)iter)->producer).data,
                              (((bson_json_reader_t *)iter)->producer).buf,
                              (((bson_json_reader_t *)iter)->producer).buf_size);
        }
        if ((long)sVar22 < 0) {
          if (error != (bson_error_t *)0x0) {
            bson_set_error(error,1,3,"reader cb failed");
            return (char *)0xffffffff;
          }
          return (char *)0xffffffff;
        }
        if (sVar22 == 0) break;
        (((bson_json_reader_t *)iter)->producer).bytes_read = sVar22;
        jsonsl_feed(((bson_json_reader_t *)iter)->json,
                    (jsonsl_char_t *)(((bson_json_reader_t *)iter)->producer).buf,sVar22);
        if (((bson_json_reader_t *)iter)->should_reset == true) {
          jsonsl_reset(((bson_json_reader_t *)iter)->json);
          ((bson_json_reader_t *)iter)->should_reset = false;
          puVar11 = (((bson_json_reader_t *)iter)->producer).buf;
          memmove(puVar11,puVar11 + ((bson_json_reader_t *)iter)->advance,
                  sVar22 - ((bson_json_reader_t *)iter)->advance);
          psVar1 = &(((bson_json_reader_t *)iter)->producer).bytes_read;
          *psVar1 = *psVar1 - ((bson_json_reader_t *)iter)->advance;
          goto LAB_00111ddb;
        }
        if (((bson_json_reader_t *)iter)->error->domain != 0) {
          return (char *)0xffffffff;
        }
        uVar14 = ((bson_json_reader_t *)iter)->json_text_pos;
        if ((uVar14 != 0xffffffffffffffff) &&
           (uVar4 = ((bson_json_reader_t *)iter)->json->pos, uVar17 = uVar4 - uVar14,
           uVar14 <= uVar4 && uVar17 != 0)) {
          if (uVar17 < sVar22) {
            sVar22 = uVar17;
          }
          lVar21 = uVar14 - sVar3;
          if (lVar21 < 1) {
            lVar21 = 0;
          }
          _bson_json_buf_append
                    (&((bson_json_reader_t *)iter)->tok_accumulator,
                     (((bson_json_reader_t *)iter)->producer).buf + lVar21,sVar22);
        }
        (((bson_json_reader_t *)iter)->producer).bytes_read = 0;
        bVar24 = true;
        sVar22 = 0;
      }
      if (!bVar24) {
        return (char *)0x0;
      }
LAB_00111ddb:
      if ((((bson_json_reader_t *)iter)->bson).read_state != BSON_JSON_DONE) {
        _bson_json_read_corrupt((bson_json_reader_t *)iter,"%s","Incomplete JSON");
        return (char *)0xffffffff;
      }
      return (char *)0x1;
    }
    bson_json_reader_read_cold_1();
    p_Var20 = (((bson_json_reader_t *)iter)->producer).dcb;
    if (p_Var20 == (bson_json_destroy_cb)0x0) {
      _bson_json_buf_ensure((bson_json_buf_t *)iter,__n + 1);
      mem = (((bson_json_reader_t *)iter)->producer).data;
    }
    else {
      mem = (((bson_json_reader_t *)iter)->producer).data;
      if ((((bson_json_reader_t *)iter)->producer).cb < p_Var20 + __n + 1) {
        uVar14 = (ulong)(p_Var20 + __n) >> 1 | (ulong)(p_Var20 + __n);
        uVar14 = uVar14 >> 2 | uVar14;
        uVar14 = uVar14 >> 4 | uVar14;
        uVar14 = uVar14 >> 8 | uVar14;
        uVar14 = uVar14 >> 0x10 | uVar14;
        num_bytes = (bson_json_reader_cb)((uVar14 >> 0x20 | uVar14) + 1);
        (((bson_json_reader_t *)iter)->producer).cb = num_bytes;
        mem = bson_realloc(mem,(size_t)num_bytes);
        (((bson_json_reader_t *)iter)->producer).data = mem;
      }
    }
    memcpy((bson_json_destroy_cb)((long)mem + (long)(((bson_json_reader_t *)iter)->producer).dcb),
           length,__n);
    p_Var20 = (((bson_json_reader_t *)iter)->producer).dcb + __n;
    (((bson_json_reader_t *)iter)->producer).dcb = p_Var20;
    pcVar10 = (char *)(((bson_json_reader_t *)iter)->producer).data;
    pcVar10[(long)p_Var20] = '\0';
    return pcVar10;
  }
  puVar11 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
  uVar8 = *(uint *)&(((bson_json_reader_t *)iter)->producer).dcb;
  bVar2 = puVar11[uVar8];
  ((bson_value_t *)&(((bson_json_reader_t *)iter)->producer).bytes_parsed)->value_type = (uint)bVar2
  ;
  switch(bVar2) {
  case 1:
    dVar5 = bson_iter_double(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_double = dVar5;
    break;
  case 2:
    pcVar10 = bson_iter_utf8(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 3:
    bson_iter_document(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                       (uint8_t **)
                       &((anon_union_24_17_78d57918_for_value *)
                        &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 4:
    bson_iter_array(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                    (uint8_t **)
                    &((anon_union_24_17_78d57918_for_value *)
                     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 5:
    bson_iter_binary(iter,(bson_subtype_t *)&((bson_json_reader_t *)iter)->field_0x44,
                     (uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                     (uint8_t **)
                     &((anon_union_24_17_78d57918_for_value *)
                      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 6:
  case 10:
    break;
  case 7:
    pbVar16 = bson_iter_oid(iter);
    dst = (anon_union_24_17_78d57918_for_value *)
          &(((bson_json_reader_t *)iter)->producer).all_whitespace;
    goto LAB_00111b7e;
  case 8:
    _Var7 = bson_iter_bool(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_bool = _Var7;
    break;
  case 9:
    pcVar10 = (char *)bson_iter_date_time(iter);
    goto LAB_00111c23;
  case 0xb:
    pcVar10 = bson_iter_regex(iter,(char **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 0xc:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = 0;
    pbVar16 = (bson_oid_t *)0x0;
    if (puVar11[uVar8] == '\f') {
      uVar8 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar9 = *(int *)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + -1;
      if (*(int *)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) == 0) {
        iVar9 = 0;
      }
      *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar9;
      (((anon_union_24_17_78d57918_for_value *)
       &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str =
           (char *)(puVar11 + uVar8);
      pbVar16 = (bson_oid_t *)(puVar11 + (uint)(((bson_json_reader_t *)iter)->producer).buf_size);
    }
    dst = (anon_union_24_17_78d57918_for_value *)&((bson_json_reader_t *)iter)->field_0x44;
LAB_00111b7e:
    bson_oid_copy(pbVar16,&dst->v_oid);
    break;
  case 0xd:
    if (puVar11[uVar8] == '\r') {
      iVar9 = 1;
      if (1 < *(int *)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar9 = *(int *)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      iVar9 = iVar9 + -1;
      puVar12 = puVar11 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      iVar9 = 0;
      puVar12 = (uint8_t *)0x0;
    }
    *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar9;
    goto LAB_00111c30;
  case 0xe:
    if (puVar11[uVar8] == '\x0e') {
      puVar12 = puVar11 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar9 = 1;
      if (1 < *(int *)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar9 = *(int *)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      iVar9 = iVar9 + -1;
    }
    else {
      puVar12 = (uint8_t *)0x0;
      iVar9 = 0;
    }
    *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar9;
LAB_00111c30:
    (((anon_union_24_17_78d57918_for_value *)
     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str = (char *)puVar12;
    break;
  case 0xf:
    pcVar10 = bson_iter_codewscope
                        (iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x48,
                         (uint32_t *)&((bson_json_reader_t *)iter)->field_0x4c,
                         (uint8_t **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 0x10:
    iVar19 = 0;
    if (puVar11[uVar8] == '\x10') {
      iVar19 = *(int32_t *)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar19;
    break;
  case 0x11:
    iVar19 = 0;
    uVar18 = 0;
    if (puVar11[uVar8] == '\x11') {
      uVar18 = *(undefined8 *)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      iVar19 = (int32_t)((ulong)uVar18 >> 0x20);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar19;
    *(int *)&(((bson_json_reader_t *)iter)->producer).field_0x3c = (int)uVar18;
    break;
  case 0x12:
    if (puVar11[uVar8] == '\x12') {
      pcVar10 = *(char **)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    else {
      pcVar10 = (char *)0x0;
    }
LAB_00111c23:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = (int64_t)pcVar10;
    break;
  case 0x13:
    if (puVar11[uVar8] == '\x13') {
      iVar6 = *(int64_t *)
               ((long)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + 8);
      ((anon_union_24_17_78d57918_for_value *)
      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64 =
           *(int64_t *)(puVar11 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      *(int64_t *)&((bson_json_reader_t *)iter)->field_0x40 = iVar6;
    }
    break;
  default:
    if ((bVar2 != BSON_TYPE_MAXKEY) && (bVar2 != 0xff)) {
      return (char *)0x0;
    }
  }
  return (char *)(bson_value_t *)&(((bson_json_reader_t *)iter)->producer).bytes_parsed;
}

Assistant:

const char *
bson_iter_utf8 (const bson_iter_t *iter, /* IN */
                uint32_t *length)        /* OUT */
{
   BSON_ASSERT (iter);

   if (ITER_TYPE (iter) == BSON_TYPE_UTF8) {
      if (length) {
         *length = bson_iter_utf8_len_unsafe (iter);
      }

      return (const char *) (iter->raw + iter->d2);
   }

   if (length) {
      *length = 0;
   }

   return NULL;
}